

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O2

void RescalerExportRowShrink_SSE2(WebPRescaler *wrk)

{
  __m128i *palVar1;
  uint8_t *puVar2;
  rescaler_t *prVar3;
  int iVar4;
  uint uVar5;
  rescaler_t rVar6;
  int iVar7;
  long lVar8;
  rescaler_t *src;
  long lVar9;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i mult_y;
  __m128i mult_xy;
  __m128i E3;
  __m128i E2;
  __m128i E1;
  __m128i E0;
  __m128i B3;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  __m128i local_f8;
  __m128i local_e8;
  rescaler_t *local_d8;
  WebPRescaler *local_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  ulong local_48;
  ulong uStack_40;
  
  puVar2 = wrk->dst;
  prVar3 = wrk->irow;
  lVar8 = (long)wrk->num_channels * (long)wrk->dst_width;
  iVar4 = wrk->y_accum * wrk->fy_scale;
  uVar5 = wrk->fxy_scale;
  local_e8[0] = (ulong)uVar5;
  local_e8[1]._0_4_ = uVar5;
  local_e8[1]._4_4_ = 0;
  if (iVar4 == 0) {
    lVar9 = 0;
    while (lVar9 + 8 <= (long)(int)lVar8) {
      palVar1 = (__m128i *)(prVar3 + lVar9);
      local_f8 = *palVar1;
      local_108 = *(ulong *)(prVar3 + lVar9 + 4);
      uStack_100 = *(ulong *)((long)(prVar3 + lVar9 + 4) + 8);
      local_118 = (ulong)(*palVar1)[0] >> 0x20;
      uStack_110 = (ulong)(*palVar1)[1] >> 0x20;
      local_128 = local_108 >> 0x20;
      uStack_120 = uStack_100 >> 0x20;
      *(undefined1 (*) [16])(prVar3 + lVar9 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(prVar3 + lVar9) = (undefined1  [16])0x0;
      ProcessRow_SSE2(&local_f8,(__m128i *)&local_108,(__m128i *)&local_118,(__m128i *)&local_128,
                      &local_e8,puVar2 + lVar9);
      lVar9 = lVar9 + 8;
    }
    for (; lVar9 < (int)lVar8; lVar9 = lVar9 + 1) {
      iVar4 = (int)((ulong)prVar3[lVar9] * (ulong)uVar5 + 0x80000000 >> 0x20);
      if (0xff < iVar4) {
        iVar4 = 0xff;
      }
      puVar2[lVar9] = (uint8_t)iVar4;
      prVar3[lVar9] = 0;
    }
  }
  else {
    src = wrk->frow;
    uVar5 = -iVar4;
    local_f8[0] = (ulong)uVar5;
    local_f8[1]._0_4_ = uVar5;
    local_f8[1]._4_4_ = 0;
    lVar9 = 0;
    local_d8 = src;
    local_d0 = wrk;
    while (lVar9 + 8 <= lVar8) {
      local_a8 = *(ulong *)(prVar3 + lVar9);
      uStack_a0 = *(ulong *)((long)(prVar3 + lVar9) + 8);
      local_98 = *(ulong *)(prVar3 + lVar9 + 4);
      uStack_90 = *(ulong *)((long)(prVar3 + lVar9 + 4) + 8);
      local_c8 = local_a8 >> 0x20;
      uStack_c0 = uStack_a0 >> 0x20;
      local_b8 = local_98 >> 0x20;
      uStack_b0 = uStack_90 >> 0x20;
      LoadDispatchAndMult_SSE2
                (src,&local_f8,(__m128i *)&local_108,(__m128i *)&local_118,(__m128i *)&local_128,
                 (__m128i *)&local_48);
      local_78 = local_c8 - (local_128 >> 0x20);
      lStack_70 = uStack_c0 - (uStack_120 >> 0x20);
      local_88 = local_b8 - (local_48 >> 0x20);
      lStack_80 = uStack_b0 - (uStack_40 >> 0x20);
      local_58 = local_a8 - (local_108 >> 0x20);
      lStack_50 = uStack_a0 - (uStack_100 >> 0x20);
      local_68 = local_98 - (local_118 >> 0x20);
      lStack_60 = uStack_90 - (uStack_110 >> 0x20);
      *(ulong *)(prVar3 + lVar9) = local_128 & 0xffffffff00000000 | local_108 >> 0x20;
      *(ulong *)((long)(prVar3 + lVar9) + 8) = uStack_120 & 0xffffffff00000000 | uStack_100 >> 0x20;
      *(ulong *)(prVar3 + lVar9 + 4) = local_48 & 0xffffffff00000000 | local_118 >> 0x20;
      *(ulong *)((long)(prVar3 + lVar9 + 4) + 8) =
           uStack_40 & 0xffffffff00000000 | uStack_110 >> 0x20;
      ProcessRow_SSE2((__m128i *)&local_58,(__m128i *)&local_68,(__m128i *)&local_78,
                      (__m128i *)&local_88,&local_e8,puVar2 + lVar9);
      src = src + 8;
      lVar9 = lVar9 + 8;
    }
    for (; lVar9 < lVar8; lVar9 = lVar9 + 1) {
      rVar6 = (rescaler_t)((ulong)local_d8[lVar9] * (ulong)uVar5 >> 0x20);
      iVar7 = (int)((ulong)local_d0->fxy_scale * (ulong)(prVar3[lVar9] - rVar6) + 0x80000000 >> 0x20
                   );
      iVar4 = 0xff;
      if (iVar7 < 0x100) {
        iVar4 = iVar7;
      }
      puVar2[lVar9] = (uint8_t)iVar4;
      prVar3[lVar9] = rVar6;
    }
  }
  return;
}

Assistant:

static void RescalerExportRowShrink_SSE2(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const uint32_t yscale = wrk->fy_scale * (-wrk->y_accum);
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(!wrk->y_expand);
  if (yscale) {
    const int scale_xy = wrk->fxy_scale;
    const __m128i mult_xy = _mm_set_epi32(0, scale_xy, 0, scale_xy);
    const __m128i mult_y = _mm_set_epi32(0, yscale, 0, yscale);
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3, B0, B1, B2, B3;
      LoadDispatchAndMult_SSE2(irow + x_out, NULL, &A0, &A1, &A2, &A3);
      LoadDispatchAndMult_SSE2(frow + x_out, &mult_y, &B0, &B1, &B2, &B3);
      {
        const __m128i D0 = _mm_srli_epi64(B0, WEBP_RESCALER_RFIX);   // = frac
        const __m128i D1 = _mm_srli_epi64(B1, WEBP_RESCALER_RFIX);
        const __m128i D2 = _mm_srli_epi64(B2, WEBP_RESCALER_RFIX);
        const __m128i D3 = _mm_srli_epi64(B3, WEBP_RESCALER_RFIX);
        const __m128i E0 = _mm_sub_epi64(A0, D0);   // irow[x] - frac
        const __m128i E1 = _mm_sub_epi64(A1, D1);
        const __m128i E2 = _mm_sub_epi64(A2, D2);
        const __m128i E3 = _mm_sub_epi64(A3, D3);
        const __m128i F2 = _mm_slli_epi64(D2, 32);
        const __m128i F3 = _mm_slli_epi64(D3, 32);
        const __m128i G0 = _mm_or_si128(D0, F2);
        const __m128i G1 = _mm_or_si128(D1, F3);
        _mm_storeu_si128((__m128i*)(irow + x_out + 0), G0);
        _mm_storeu_si128((__m128i*)(irow + x_out + 4), G1);
        ProcessRow_SSE2(&E0, &E1, &E2, &E3, &mult_xy, dst + x_out);
      }
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint32_t frac = (int)MULT_FIX_FLOOR(frow[x_out], yscale);
      const int v = (int)MULT_FIX(irow[x_out] - frac, wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = frac;   // new fractional start
    }
  } else {
    const uint32_t scale = wrk->fxy_scale;
    const __m128i mult = _mm_set_epi32(0, scale, 0, scale);
    const __m128i zero = _mm_setzero_si128();
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3;
      LoadDispatchAndMult_SSE2(irow + x_out, NULL, &A0, &A1, &A2, &A3);
      _mm_storeu_si128((__m128i*)(irow + x_out + 0), zero);
      _mm_storeu_si128((__m128i*)(irow + x_out + 4), zero);
      ProcessRow_SSE2(&A0, &A1, &A2, &A3, &mult, dst + x_out);
    }
    for (; x_out < x_out_max; ++x_out) {
      const int v = (int)MULT_FIX(irow[x_out], scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = 0;
    }
  }
}